

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# override.hpp
# Opt level: O2

method_result __thiscall
boost::python::override::operator()
          (override *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a0,
          uint *a1)

{
  pointer pcVar1;
  _object *p_Var2;
  uint *in_RCX;
  handle<_object> local_30;
  handle<_object> local_28;
  
  pcVar1 = (a0->_M_dataplus)._M_p;
  converter::
  arg_to_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  arg_to_python((arg_to_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_28,(string *)a1);
  converter::arg_to_python<unsigned_int>::arg_to_python
            ((arg_to_python<unsigned_int> *)&local_30,in_RCX);
  p_Var2 = (_object *)PyEval_CallFunction(pcVar1,"(OO)",local_28.m_p,local_30.m_p);
  p_Var2 = expect_non_null<_object>(p_Var2);
  *(_object **)this = p_Var2;
  handle<_object>::~handle(&local_30);
  handle<_object>::~handle(&local_28);
  return (method_result)(handle<_object>)this;
}

Assistant:

detail::method_result
operator()( BOOST_PP_ENUM_BINARY_PARAMS_Z(1, N, A, const& a) ) const
{
    detail::method_result x(
        PyEval_CallFunction(
            this->ptr()
          , const_cast<char*>("(" BOOST_PP_REPEAT_1ST(N, BOOST_PYTHON_FIXED, "O") ")")
            BOOST_PP_REPEAT_1ST(N, BOOST_PYTHON_fast_arg_to_python_get, nil)
        ));
    return x;
}